

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

bool __thiscall cmGraphVizWriter::ItemExcluded(cmGraphVizWriter *this,cmLinkItem *item)

{
  string_view sVar1;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  undefined1 local_40 [8];
  string itemName;
  cmLinkItem *item_local;
  cmGraphVizWriter *this_local;
  
  itemName.field_2._8_8_ = item;
  psVar4 = cmLinkItem::AsStr_abi_cxx11_(item);
  std::__cxx11::string::string((string *)local_40,(string *)psVar4);
  bVar2 = ItemNameFilteredOut(this,(string *)local_40);
  if (bVar2) {
    this_local._7_1_ = true;
    goto LAB_0075bef2;
  }
  if (*(long *)(itemName.field_2._8_8_ + 0x20) == 0) {
    this_local._7_1_ = (bool)((this->GenerateForExternals ^ 0xffU) & 1);
    goto LAB_0075bef2;
  }
  TVar3 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(itemName.field_2._8_8_ + 0x20));
  if (TVar3 == UTILITY) {
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
    bVar2 = cmHasLiteralPrefix<8ul>(sVar1,(char (*) [8])"Nightly");
    if (!bVar2) {
      sVar1 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
      bVar2 = cmHasLiteralPrefix<11ul>(sVar1,(char (*) [11])"Continuous");
      if (!bVar2) {
        sVar1 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
        bVar2 = cmHasLiteralPrefix<13ul>(sVar1,(char (*) [13])"Experimental");
        if (!bVar2) goto LAB_0075be71;
      }
    }
    this_local._7_1_ = true;
  }
  else {
LAB_0075be71:
    bVar2 = cmGeneratorTarget::IsImported(*(cmGeneratorTarget **)(itemName.field_2._8_8_ + 0x20));
    if ((bVar2) && ((this->GenerateForExternals & 1U) == 0)) {
      this_local._7_1_ = true;
    }
    else {
      TVar3 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(itemName.field_2._8_8_ + 0x20));
      bVar2 = TargetTypeEnabled(this,TVar3);
      this_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
    }
  }
LAB_0075bef2:
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmGraphVizWriter::ItemExcluded(cmLinkItem const& item)
{
  auto const itemName = item.AsStr();

  if (this->ItemNameFilteredOut(itemName)) {
    return true;
  }

  if (item.Target == nullptr) {
    return !this->GenerateForExternals;
  }

  if (item.Target->GetType() == cmStateEnums::UTILITY) {
    if (cmHasLiteralPrefix(itemName, "Nightly") ||
        cmHasLiteralPrefix(itemName, "Continuous") ||
        cmHasLiteralPrefix(itemName, "Experimental")) {
      return true;
    }
  }

  if (item.Target->IsImported() && !this->GenerateForExternals) {
    return true;
  }

  return !this->TargetTypeEnabled(item.Target->GetType());
}